

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * match(MatchState *ms,char *s,char *p)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  char *local_80;
  char *local_68;
  uint local_60;
  char *res;
  int m;
  char *ep_1;
  char previous;
  char *ep;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  ep = p;
  p_local = s;
LAB_0011c5f7:
  switch(*ep) {
  case '\0':
    return p_local;
  default:
    break;
  case '$':
    if (ep[1] == '\0') {
      if (p_local == ms->src_end) {
        local_68 = p_local;
      }
      else {
        local_68 = (char *)0x0;
      }
      return local_68;
    }
    break;
  case '%':
    if (ep[1] == 'b') {
      p_local = matchbalance(ms,p_local,ep + 2);
      if (p_local == (char *)0x0) {
        return (char *)0x0;
      }
      ep = ep + 4;
    }
    else if (ep[1] == 'f') {
      pcVar3 = ep + 2;
      if (*pcVar3 != '[') {
        luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
      }
      ep = classend(ms,pcVar3);
      if (p_local == ms->src_init) {
        local_60 = 0;
      }
      else {
        local_60 = (uint)p_local[-1];
      }
      iVar1 = matchbracketclass(local_60 & 0xff,pcVar3,ep + -1);
      if ((iVar1 != 0) ||
         (iVar1 = matchbracketclass((uint)(byte)*p_local,pcVar3,ep + -1), iVar1 == 0)) {
        return (char *)0x0;
      }
    }
    else {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(uint)(byte)ep[1]] & 0x800) == 0) break;
      p_local = match_capture(ms,p_local,(uint)(byte)ep[1]);
      if (p_local == (char *)0x0) {
        return (char *)0x0;
      }
      ep = ep + 2;
    }
    goto LAB_0011c5f7;
  case '(':
    if (ep[1] == ')') {
      pcVar3 = start_capture(ms,p_local,ep + 2,-2);
      return pcVar3;
    }
    pcVar3 = start_capture(ms,p_local,ep + 1,-1);
    return pcVar3;
  case ')':
    pcVar3 = end_capture(ms,p_local,ep + 1);
    return pcVar3;
  }
  pcVar3 = classend(ms,ep);
  bVar5 = false;
  if (p_local < ms->src_end) {
    iVar1 = singlematch((uint)(byte)*p_local,ep,pcVar3);
    bVar5 = iVar1 != 0;
  }
  switch(*pcVar3) {
  case '*':
    pcVar3 = max_expand(ms,p_local,ep,pcVar3);
    return pcVar3;
  case '+':
    if (bVar5) {
      local_80 = max_expand(ms,p_local + 1,ep,pcVar3);
    }
    else {
      local_80 = (char *)0x0;
    }
    return local_80;
  default:
    if (!bVar5) {
      return (char *)0x0;
    }
    p_local = p_local + 1;
    ep = pcVar3;
    break;
  case '-':
    pcVar3 = min_expand(ms,p_local,ep,pcVar3);
    return pcVar3;
  case '?':
    if ((bVar5) && (pcVar4 = match(ms,p_local + 1,pcVar3 + 1), pcVar4 != (char *)0x0)) {
      return pcVar4;
    }
    ep = pcVar3 + 1;
  }
  goto LAB_0011c5f7;
}

Assistant:

static const char*match(MatchState*ms,const char*s,const char*p){
init:
switch(*p){
case'(':{
if(*(p+1)==')')
return start_capture(ms,s,p+2,(-2));
else
return start_capture(ms,s,p+1,(-1));
}
case')':{
return end_capture(ms,s,p+1);
}
case'%':{
switch(*(p+1)){
case'b':{
s=matchbalance(ms,s,p+2);
if(s==NULL)return NULL;
p+=4;goto init;
}
case'f':{
const char*ep;char previous;
p+=2;
if(*p!='[')
luaL_error(ms->L,"missing "LUA_QL("[")" after "
LUA_QL("%%f")" in pattern");
ep=classend(ms,p);
previous=(s==ms->src_init)?'\0':*(s-1);
if(matchbracketclass(uchar(previous),p,ep-1)||
!matchbracketclass(uchar(*s),p,ep-1))return NULL;
p=ep;goto init;
}
default:{
if(isdigit(uchar(*(p+1)))){
s=match_capture(ms,s,uchar(*(p+1)));
if(s==NULL)return NULL;
p+=2;goto init;
}
goto dflt;
}
}
}
case'\0':{
return s;
}
case'$':{
if(*(p+1)=='\0')
return(s==ms->src_end)?s:NULL;
else goto dflt;
}
default:dflt:{
const char*ep=classend(ms,p);
int m=s<ms->src_end&&singlematch(uchar(*s),p,ep);
switch(*ep){
case'?':{
const char*res;
if(m&&((res=match(ms,s+1,ep+1))!=NULL))
return res;
p=ep+1;goto init;
}
case'*':{
return max_expand(ms,s,p,ep);
}
case'+':{
return(m?max_expand(ms,s+1,p,ep):NULL);
}
case'-':{
return min_expand(ms,s,p,ep);
}
default:{
if(!m)return NULL;
s++;p=ep;goto init;
}
}
}
}
}